

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lritdump.cc
# Opt level: O2

int json(Options *opts,string *name)

{
  ostream *poVar1;
  File file;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_b0;
  File local_a0;
  
  lrit::File::File(&local_a0,name);
  lrit::toJSON_abi_cxx11_((lrit *)&local_b0,&local_a0);
  poVar1 = nlohmann::operator<<((ostream *)&std::cout,&local_b0);
  std::endl<char,std::char_traits<char>>(poVar1);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::~basic_json(&local_b0);
  lrit::File::~File(&local_a0);
  return 0;
}

Assistant:

int json(const Options& opts, const std::string& name) {
  auto file = lrit::File(name);
  std::cout << toJSON(file) << std::endl;
  return 0;
}